

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetSegmentLocalRotationHelical
          (VClient *this,string *i_rSubjectName,string *i_rSegmentName,double (*o_rThreeVector) [3],
          bool *o_rbOccluded)

{
  Enum EVar1;
  Enum _Result;
  double RotationArray [9];
  undefined1 local_40 [8];
  scoped_lock Lock;
  bool *o_rbOccluded_local;
  double (*o_rThreeVector_local) [3];
  string *i_rSegmentName_local;
  string *i_rSubjectName_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rbOccluded;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_40,&this->m_FrameMutex);
  ClientUtils::Clear<double,3u>(o_rThreeVector);
  ClientUtils::Clear((bool *)Lock._8_8_);
  EVar1 = GetSegmentLocalRotationMatrix
                    (this,i_rSubjectName,i_rSegmentName,(double (*) [9])&stack0xffffffffffffff68,
                     (bool *)Lock._8_8_);
  if ((EVar1 == Success) && ((*(byte *)Lock._8_8_ & 1) == 0)) {
    ClientUtils::MatrixToHelical((double *)&stack0xffffffffffffff68,o_rThreeVector);
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_40);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetSegmentLocalRotationHelical( const std::string & i_rSubjectName, 
                                                      const std::string & i_rSegmentName, 
                                                            double    ( & o_rThreeVector)[3], 
                                                            bool        & o_rbOccluded ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Clear( o_rThreeVector );
  Clear( o_rbOccluded );

  // Get the answer as a rotation matrix
  double RotationArray[ 9 ];
  const Result::Enum _Result = GetSegmentLocalRotationMatrix( i_rSubjectName, i_rSegmentName, RotationArray, o_rbOccluded );

  if( Result::Success == _Result && !o_rbOccluded )
  {
    MatrixToHelical( RotationArray, o_rThreeVector );
  }

  return _Result;
}